

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O0

void __thiscall ScriptException::~ScriptException(ScriptException *this)

{
  ScriptException *this_local;
  
  FreeExcepInfo(&this->ei);
  return;
}

Assistant:

ScriptException::~ScriptException(void)
{
    FreeExcepInfo(&ei);
}